

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::BasicResetCase
          (BasicResetCase *this,EglTestContext *eglTestCtx,char *name,char *description,
          Params *params)

{
  Params local_88;
  Params *local_30;
  Params *params_local;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  BasicResetCase *this_local;
  
  local_30 = params;
  params_local = (Params *)description;
  description_local = name;
  name_local = (char *)eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  RobustnessTestCase::Params::Params(&local_88,params);
  ContextResetCase::ContextResetCase
            (&this->super_ContextResetCase,eglTestCtx,name,description,&local_88);
  RobustnessTestCase::Params::~Params(&local_88);
  (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__BasicResetCase_0326a460;
  return;
}

Assistant:

BasicResetCase (EglTestContext& eglTestCtx, const char* name, const char* description, Params params)
		: ContextResetCase (eglTestCtx, name, description, params) {}